

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_add_constrain_inside_midnode(REF_GRID ref_grid,REF_INT *nodes,REF_INT new_node)

{
  REF_INT id_00;
  REF_NODE pRVar1;
  REF_GEOM ref_geom_00;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT sense;
  REF_DBL uv2 [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  REF_DBL uv [2];
  REF_INT id;
  REF_INT type;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_INT new_node_local;
  REF_INT *nodes_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  ref_geom_00 = ref_grid->geom;
  id_00 = nodes[3];
  ref_grid_local._4_4_ =
       ref_geom_cell_tuv(ref_geom_00,*nodes,nodes,2,uv1 + 1,&ref_private_macro_code_rss_1);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ =
         ref_geom_cell_tuv(ref_geom_00,nodes[1],nodes,2,uv2 + 1,&ref_private_macro_code_rss_1);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ =
           ref_geom_cell_tuv(ref_geom_00,nodes[2],nodes,2,(REF_DBL *)&ref_private_macro_code_rss,
                             &ref_private_macro_code_rss_1);
      if (ref_grid_local._4_4_ == 0) {
        uv0[1] = (uv1[1] + uv2[1] + _ref_private_macro_code_rss) / 3.0;
        ref_grid_local._4_4_ = ref_geom_add(ref_geom_00,new_node,2,id_00,uv0 + 1);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ =
               ref_egads_eval_at(ref_geom_00,2,id_00,uv0 + 1,pRVar1->real + new_node * 0xf,
                                 (REF_DBL *)0x0);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x3d5,"ref_geom_add_constrain_inside_midnode",(ulong)ref_grid_local._4_4_,"eval")
            ;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x3d1,"ref_geom_add_constrain_inside_midnode",(ulong)ref_grid_local._4_4_,
                 "new geom");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x3cd,"ref_geom_add_constrain_inside_midnode",(ulong)ref_grid_local._4_4_,"cell uv2")
        ;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3cb,
             "ref_geom_add_constrain_inside_midnode",(ulong)ref_grid_local._4_4_,"cell uv1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3c9,
           "ref_geom_add_constrain_inside_midnode",(ulong)ref_grid_local._4_4_,"cell uv0");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_constrain_inside_midnode(REF_GRID ref_grid,
                                                         REF_INT *nodes,
                                                         REF_INT new_node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT type, id;
  REF_DBL uv[2], uv0[2], uv1[2], uv2[2];
  REF_INT sense;

  type = REF_GEOM_FACE;
  id = nodes[3];

  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, type, uv0, &sense),
      "cell uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, type, uv1, &sense),
      "cell uv1");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[2], nodes, type, uv2, &sense),
      "cell uv2");

  uv[0] = (uv0[0] + uv1[0] + uv2[0]) / 3.0;
  uv[1] = (uv0[1] + uv1[1] + uv2[1]) / 3.0;
  RSS(ref_geom_add(ref_geom, new_node, type, id, uv), "new geom");

  RSS(ref_egads_eval_at(ref_geom, type, id, uv,
                        ref_node_xyz_ptr(ref_node, new_node), NULL),
      "eval");

  return REF_SUCCESS;
}